

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O2

int __thiscall
ncnn::YoloDetectionOutput::forward_inplace
          (YoloDetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs
          ,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar6;
  undefined8 uVar5;
  undefined4 uVar7;
  pointer pMVar8;
  void *pvVar9;
  uint uVar10;
  bool bVar11;
  pointer pvVar12;
  ulong uVar13;
  float *pfVar14;
  long lVar15;
  ulong uVar16;
  int *piVar17;
  int iVar18;
  int iVar19;
  pointer pBVar20;
  int q;
  pointer pBVar21;
  ulong uVar22;
  ulong uVar23;
  int i_2;
  int j;
  Mat *pMVar24;
  int i;
  long lVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined4 extraout_XMM0_Db;
  float fVar33;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 in_XMM1 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  uint local_238;
  int iStack_234;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  float confidence;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  int local_19c;
  size_t local_190;
  vector<int,_std::allocator<int>_> picked;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  pointer local_110;
  pointer local_108;
  pointer local_100;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_box_bbox_scores;
  float local_d8;
  float fStack_d4;
  
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar16 = 0;
  do {
    pMVar8 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 6) <= uVar16) {
      if (all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl
          .super__Vector_impl_data._M_start !=
          all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        if (all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start !=
            all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          qsort_descent_inplace<ncnn::BBoxRect>
                    (&all_bbox_rects,&all_bbox_scores,0,
                     (int)((ulong)((long)all_bbox_scores.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)all_bbox_scores.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2) + -1);
        }
      }
      picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      fVar26 = this->nms_threshold;
      uVar16 = ((long)all_bbox_rects.
                      super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)all_bbox_rects.
                     super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x14;
      iVar18 = (int)uVar16;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&bbox_rects,(long)iVar18,
                 (allocator_type *)&bbox_scores);
      uVar13 = 0;
      uVar23 = 0;
      if (0 < iVar18) {
        uVar23 = uVar16 & 0xffffffff;
      }
      pfVar14 = &(all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                  ._M_impl.super__Vector_impl_data._M_start)->xmax;
      for (; uVar23 != uVar13; uVar13 = uVar13 + 1) {
        uVar4 = ((BBoxRect *)(pfVar14 + -2))->xmin;
        uVar7 = ((BBoxRect *)(pfVar14 + -2))->ymin;
        (&(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
           super__Vector_impl_data._M_start)->xmin)[uVar13] =
             ((float)((ulong)*(undefined8 *)pfVar14 >> 0x20) - (float)uVar7) *
             ((float)*(undefined8 *)pfVar14 - (float)uVar4);
        pfVar14 = pfVar14 + 5;
      }
      for (iVar6 = 0;
          bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(bbox_scores.super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,iVar6),
          iVar6 < iVar18; iVar6 = iVar6 + 1) {
        pBVar21 = all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar6;
        uVar16 = (ulong)((long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2;
        uVar13 = uVar16 & 0xffffffff;
        if ((int)uVar16 < 1) {
          uVar13 = 0;
        }
        bVar11 = true;
        for (uVar16 = 0; uVar13 != uVar16; uVar16 = uVar16 + 1) {
          iVar19 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar16];
          fVar32 = pBVar21->xmin;
          fVar34 = all_bbox_rects.
                   super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar19].xmax;
          fVar31 = 0.0;
          if (fVar32 <= fVar34) {
            pBVar20 = all_bbox_rects.
                      super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar19;
            fVar27 = pBVar21->xmax;
            fVar28 = pBVar20->xmin;
            if (fVar28 <= fVar27) {
              fVar29 = pBVar21->ymin;
              fVar30 = pBVar20->ymax;
              if (fVar29 <= fVar30) {
                fVar33 = pBVar21->ymax;
                fVar35 = pBVar20->ymin;
                if (fVar35 <= fVar33) {
                  if (fVar27 <= fVar34) {
                    fVar34 = fVar27;
                  }
                  if (fVar28 <= fVar32) {
                    fVar28 = fVar32;
                  }
                  if (fVar33 <= fVar30) {
                    fVar30 = fVar33;
                  }
                  if (fVar35 <= fVar29) {
                    fVar35 = fVar29;
                  }
                  fVar31 = (fVar30 - fVar35) * (fVar34 - fVar28);
                }
              }
            }
          }
          if (fVar26 < fVar31 / (((&(bbox_rects.
                                     super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->xmin)[iVar6] -
                                 fVar31) +
                                (&(bbox_rects.
                                   super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->xmin)[iVar19])) {
            bVar11 = false;
          }
        }
        if (bVar11) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (&picked,(value_type_conflict2 *)&bbox_scores);
          iVar6 = (int)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&bbox_rects);
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      for (lVar15 = 0;
          lVar15 < (int)((ulong)((long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2); lVar15 = lVar15 + 1)
      {
        iVar18 = picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15];
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                  (&bbox_rects,
                   all_bbox_rects.
                   super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar18);
        std::vector<float,_std::allocator<float>_>::push_back
                  (&bbox_scores,
                   all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + iVar18);
      }
      uVar16 = ((long)bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x14;
      iVar18 = (int)uVar16;
      if (iVar18 == 0) {
        iVar6 = 0;
      }
      else {
        pMVar24 = (bottom_top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        Mat::create(pMVar24,6,iVar18,4,opt->blob_allocator);
        pvVar9 = pMVar24->data;
        iVar6 = -100;
        if ((pvVar9 != (void *)0x0) && ((long)pMVar24->c * pMVar24->cstep != 0)) {
          iVar6 = 0;
          uVar16 = uVar16 & 0xffffffff;
          if (iVar18 < 1) {
            uVar16 = 0;
          }
          piVar17 = &(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_start)->label;
          for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
            fVar26 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13];
            lVar15 = (long)(int)uVar13 * (long)pMVar24->w * pMVar24->elemsize;
            *(float *)((long)pvVar9 + lVar15) = (float)(*piVar17 + 1);
            *(float *)((long)pvVar9 + lVar15 + 4) = fVar26;
            *(float *)((long)pvVar9 + lVar15 + 8) = ((BBoxRect *)(piVar17 + -4))->xmin;
            *(int *)((long)pvVar9 + lVar15 + 0xc) = piVar17[-3];
            *(int *)((long)pvVar9 + lVar15 + 0x10) = piVar17[-2];
            *(int *)((long)pvVar9 + lVar15 + 0x14) = piVar17[-1];
            piVar17 = piVar17 + 5;
          }
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
                (&bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&picked.super__Vector_base<int,_std::allocator<int>_>);
LAB_00159dc5:
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
                (&all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                );
      return iVar6;
    }
    iVar18 = pMVar8[uVar16].c / this->num_box;
    if (iVar18 != this->num_class + 5) {
      iVar6 = -1;
      goto LAB_00159dc5;
    }
    uVar3 = pMVar8[uVar16].w;
    iVar6 = pMVar8[uVar16].h;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    all_box_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_box_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    all_box_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)&bbox_scores,(long)this->num_box);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&all_box_bbox_scores,(long)this->num_box);
    pMVar24 = pMVar8 + uVar16;
    fVar26 = (float)(int)uVar3;
    fVar32 = (float)iVar6;
    auVar37._4_4_ = fVar32;
    auVar37._0_4_ = fVar26;
    auVar37._8_8_ = 0;
    auVar37 = rcpps(in_XMM1,auVar37);
    fVar34 = auVar37._0_4_;
    fVar31 = auVar37._4_4_;
    uVar10 = uVar3;
    if ((int)uVar3 < 1) {
      uVar10 = 0;
    }
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    in_XMM1 = ZEXT416((uint)(1.0 / fVar32));
    lVar15 = 0;
    while( true ) {
      uVar13 = (ulong)this->num_box;
      if ((long)uVar13 <= lVar15) break;
      iVar19 = (int)lVar15 * iVar18;
      uVar5 = *(undefined8 *)((long)(this->biases).data + lVar15 * 8);
      Mat::channel((Mat *)&bbox_rects,pMVar24,iVar19);
      pBVar21 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&bbox_rects);
      Mat::channel((Mat *)&bbox_rects,pMVar24,iVar19 + 1);
      pBVar20 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&bbox_rects);
      Mat::channel((Mat *)&bbox_rects,pMVar24,iVar19 + 2);
      local_100 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&bbox_rects);
      Mat::channel((Mat *)&bbox_rects,pMVar24,iVar19 + 3);
      local_108 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&bbox_rects);
      Mat::channel((Mat *)&bbox_rects,pMVar24,iVar19 + 4);
      local_110 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&bbox_rects);
      Mat::channel_range((Mat *)&bbox_rects,pMVar24,iVar19 + 5,this->num_class);
      (*this->softmax->_vptr_Layer[9])(this->softmax,(Mat *)&bbox_rects,opt);
      local_d8 = (float)uVar5;
      fStack_d4 = (float)((ulong)uVar5 >> 0x20);
      for (iVar19 = 0; iVar19 != iVar6; iVar19 = iVar19 + 1) {
        for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
          fVar27 = expf(-pBVar21->xmin);
          fVar28 = expf(-pBVar20->xmin);
          fVar29 = ((float)(int)uVar13 + 1.0 / (fVar27 + 1.0)) * (1.0 / fVar26);
          fVar27 = local_100->xmin;
          fVar30 = expf(local_108->xmin);
          fVar27 = expf(fVar27);
          fVar27 = fVar27 * local_d8 * 0.5 * ((1.0 - fVar26 * fVar34) * fVar34 + fVar34);
          fVar33 = fVar30 * fStack_d4 * 0.5 * ((1.0 - fVar32 * fVar31) * fVar31 + fVar31);
          fVar35 = fVar29 + fVar27;
          fVar30 = expf(-local_110->xmin);
          auVar37 = ZEXT816(0);
          uVar23 = 0;
          for (uVar22 = 0; fVar36 = auVar37._0_4_, (long)uVar22 < (long)this->num_class;
              uVar22 = uVar22 + 1) {
            picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)((long)&(bbox_rects.
                                         super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->xmin +
                                local_190 * uVar22 *
                                (long)bbox_rects.
                                      super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
            picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage =
                 (pointer)bbox_rects.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
            fVar1 = *(float *)((long)picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                              uVar13 * 4 +
                              (long)(local_19c * iVar19) *
                              (long)bbox_rects.
                                    super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            Mat::~Mat((Mat *)&picked);
            fVar2 = fVar36;
            if (fVar36 <= fVar1) {
              fVar2 = fVar1;
            }
            auVar37 = ZEXT416((uint)fVar2);
            if (fVar36 < fVar1) {
              uVar23 = uVar22 & 0xffffffff;
            }
          }
          auVar38._4_12_ = auVar37._4_12_;
          auVar38._0_4_ = fVar36 / (fVar30 + 1.0);
          in_XMM1 = auVar38;
          confidence = auVar38._0_4_;
          if (this->confidence_threshold <= auVar38._0_4_) {
            fVar28 = (1.0 / (fVar28 + 1.0) + (float)iVar19) * (1.0 / fVar32);
            picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(fVar28 - fVar33,fVar29 - fVar27);
            in_XMM1._4_4_ = extraout_XMM0_Db;
            in_XMM1._0_4_ = fVar35;
            in_XMM1._8_4_ = extraout_XMM0_Dc;
            in_XMM1._12_4_ = extraout_XMM0_Dd;
            picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(fVar33 + fVar28,fVar35);
            picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage =
                 (pointer)CONCAT44(picked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage._4_4_,(int)uVar23);
            std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                      ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                       (bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar15 * 6),(value_type *)&picked);
            std::vector<float,_std::allocator<float>_>::push_back
                      (all_box_bbox_scores.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar15,&confidence);
          }
          pBVar21 = (pointer)&pBVar21->ymin;
          pBVar20 = (pointer)&pBVar20->ymin;
          local_100 = (pointer)&local_100->ymin;
          local_108 = (pointer)&local_108->ymin;
          local_110 = (pointer)&local_110->ymin;
        }
      }
      Mat::~Mat((Mat *)&bbox_rects);
      lVar15 = lVar15 + 1;
    }
    lVar15 = 8;
    for (lVar25 = 0;
        pvVar12 = all_box_bbox_scores.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, lVar25 < (int)uVar13;
        lVar25 = lVar25 + 1) {
      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
      insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar15 + -8),
                 *(BBoxRect **)
                  ((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar15));
      std::vector<float,std::allocator<float>>::
      insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                ((vector<float,std::allocator<float>> *)&all_bbox_scores,
                 (const_iterator)
                 all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)((long)pvVar12 + lVar15 + -8),
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)
                  ((long)&(pvVar12->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar15));
      uVar13 = (ulong)(uint)this->num_box;
      lVar15 = lVar15 + 0x18;
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&all_box_bbox_scores);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               *)&bbox_scores);
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

int YoloDetectionOutput::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b=0; b<bottom_top_blobs.size(); b++)
    {
        Mat& bottom_top_blob = bottom_top_blobs[b];

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;

        std::vector< std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector< std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;

            const float bias_w = biases[pp*2];
            const float bias_h = biases[pp*2+1];

            const float* xptr = bottom_top_blob.channel(p);
            const float* yptr = bottom_top_blob.channel(p+1);
            const float* wptr = bottom_top_blob.channel(p+2);
            const float* hptr = bottom_top_blob.channel(p+3);

            const float* box_score_ptr = bottom_top_blob.channel(p+4);

            // softmax class scores
            Mat scores = bottom_top_blob.channel_range(p+5, num_class);
            softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // region box
                    float bbox_cx = (j + sigmoid(xptr[0])) / w;
                    float bbox_cy = (i + sigmoid(yptr[0])) / h;
                    float bbox_w = exp(wptr[0]) * bias_w / w;
                    float bbox_h = exp(hptr[0]) * bias_h / h;

                    float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                    float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                    float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                    float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = 0.f;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

    //                 fprintf(stderr, "%d %f %f\n", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                        BBoxRect c = { bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index };
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<int> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 0; i < (int)picked.size(); i++)
    {
        int z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = bbox_rects.size();
    if (num_detected == 0)
        return 0;

    Mat& top_blob = bottom_top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1;// +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}